

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draw.cpp
# Opt level: O1

void vera::addLabel(function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                    *_func,Node *_node,LabelType _type,float _margin)

{
  Label *this;
  undefined4 in_stack_ffffffffffffffb8;
  _Any_data local_40;
  _Manager_type local_30;
  
  this = (Label *)operator_new(0xc0);
  std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
              *)&local_40,_func);
  Label::Label(this,(function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                     *)&local_40,_node,_type,_margin);
  addLabel((Label *)CONCAT44(_margin,in_stack_ffffffffffffffb8));
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  return;
}

Assistant:

void addLabel(std::function<std::string(void)> _func, Node* _node, LabelType _type, float _margin) {
    addLabel( new vera::Label(_func, _node, _type, _margin) );
}